

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O0

int ffdkinit(fitsfile **fptr,char *name,int *status)

{
  int *in_RDX;
  undefined8 *in_RDI;
  int *in_stack_00000888;
  char *in_stack_00000890;
  fitsfile **in_stack_00000898;
  undefined4 local_4;
  
  *in_RDI = 0;
  if (*in_RDX < 1) {
    *in_RDX = -0x6a;
    ffinit(in_stack_00000898,in_stack_00000890,in_stack_00000888);
    local_4 = *in_RDX;
  }
  else {
    local_4 = *in_RDX;
  }
  return local_4;
}

Assistant:

int ffdkinit(fitsfile **fptr,      /* O - FITS file pointer                   */
           const char *name,     /* I - name of file to create              */
           int *status)          /* IO - error status                       */
/*
  Create and initialize a new FITS file on disk.  This routine differs
  from ffinit in that the input 'name' is literally taken as the name
  of the disk file to be created, and it does not support CFITSIO's 
  extended filename syntax.
*/
{
    *fptr = 0;              /* initialize null file pointer, */
                            /* regardless of the value of *status */
    if (*status > 0)
        return(*status);

    *status = CREATE_DISK_FILE;

    ffinit(fptr, name,status);

    return(*status);
}